

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk6c(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk6c_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk6c.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk6c.version);
    if ((bios->power).unk6c.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk6c.offset + 1,&(bios->power).unk6c.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk6c.offset + 2,&(bios->power).unk6c.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk6c.offset + 3,&(bios->power).unk6c.entriesnum);
      (bios->power).unk6c.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk6c.entriesnum;
      peVar5 = (envy_bios_power_unk6c_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk6c.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk6c.rlen * (int)uVar6 +
             (uint)(bios->power).unk6c.hlen + (bios->power).unk6c.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown VOLTAGE DEVICE table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk6c(struct envy_bios *bios) {
	struct envy_bios_power_unk6c *unk6c = &bios->power.unk6c;
	int i, err = 0;

	if (!unk6c->offset)
		return -EINVAL;

	bios_u8(bios, unk6c->offset + 0x0, &unk6c->version);
	switch(unk6c->version) {
	case 0x10:
		err |= bios_u8(bios, unk6c->offset + 0x1, &unk6c->hlen);
		err |= bios_u8(bios, unk6c->offset + 0x2, &unk6c->rlen);
		err |= bios_u8(bios, unk6c->offset + 0x3, &unk6c->entriesnum);
		unk6c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown VOLTAGE DEVICE table version 0x%x\n", unk6c->version);
		return -EINVAL;
	};

	err = 0;
	unk6c->entries = malloc(unk6c->entriesnum * sizeof(struct envy_bios_power_unk6c_entry));
	for (i = 0; i < unk6c->entriesnum; i++) {
		uint32_t data = unk6c->offset + unk6c->hlen + i * unk6c->rlen;

		unk6c->entries[i].offset = data;
	}

	return 0;
}